

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderAtomicCountersTests.cpp
# Opt level: O0

long __thiscall glcts::AdvancedUsageSwitchPrograms::Cleanup(AdvancedUsageSwitchPrograms *this)

{
  int width;
  int height;
  int local_14;
  int i;
  AdvancedUsageSwitchPrograms *this_local;
  
  glu::CallLogWrapper::glDeleteFramebuffers
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,
             &this->fbo_);
  glu::CallLogWrapper::glDeleteTextures
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,
             &this->rt_);
  width = glcts::anon_unknown_0::SACSubcaseBase::getWindowWidth(&this->super_SACSubcaseBase);
  height = glcts::anon_unknown_0::SACSubcaseBase::getWindowHeight(&this->super_SACSubcaseBase);
  glu::CallLogWrapper::glViewport
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0,
             0,width,height);
  glu::CallLogWrapper::glDeleteBuffers
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,8,
             this->counter_buffer_);
  glu::CallLogWrapper::glDeleteBuffers
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,
             &this->xfb_buffer_);
  glu::CallLogWrapper::glDeleteVertexArrays
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,
             &this->vao_);
  glu::CallLogWrapper::glDeleteBuffers
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,
             &this->vbo_);
  for (local_14 = 0; local_14 < 8; local_14 = local_14 + 1) {
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               this->prog_[local_14]);
  }
  glu::CallLogWrapper::glUseProgram
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0)
  ;
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glDeleteFramebuffers(1, &fbo_);
		glDeleteTextures(1, &rt_);
		glViewport(0, 0, getWindowWidth(), getWindowHeight());
		glDeleteBuffers(8, counter_buffer_);
		glDeleteBuffers(1, &xfb_buffer_);
		glDeleteVertexArrays(1, &vao_);
		glDeleteBuffers(1, &vbo_);
		for (int i = 0; i < 8; ++i)
			glDeleteProgram(prog_[i]);
		glUseProgram(0);
		return NO_ERROR;
	}